

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O2

void WebRtcNs_ProcessCore
               (NoiseSuppressionC *self,float **speechFrame,size_t num_bands,float **outFrame)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  float (*pafVar5) [256];
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  size_t sVar10;
  float **ppfVar11;
  uint uVar12;
  float fVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  uint local_110c;
  float winData [256];
  float imag [129];
  float theFilter [129];
  float magn [129];
  float fout [160];
  float real [256];
  
  if (self->initFlag != 1) {
    __assert_fail("self->initFlag == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4b9,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  uVar1 = num_bands - 1;
  if (2 < uVar1) {
    __assert_fail("(num_bands - 1) <= NUM_HIGH_BANDS_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                  ,0x4ba,
                  "void WebRtcNs_ProcessCore(NoiseSuppressionC *, const float *const *, size_t, float *const *)"
                 );
  }
  if (num_bands < 2) {
    local_110c = 1;
    ppfVar6 = (float **)0x0;
    ppfVar11 = (float **)0x0;
  }
  else {
    ppfVar6 = speechFrame + 1;
    ppfVar11 = outFrame + 1;
    local_110c = (int)self->magnLen / 4;
  }
  UpdateBuffer(*speechFrame,self->blockLen,self->anaLen,self->dataBuf);
  if (1 < num_bands) {
    pafVar5 = self->dataBufHB;
    for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
      UpdateBuffer(ppfVar6[uVar9],self->blockLen,self->anaLen,*pafVar5);
      pafVar5 = pafVar5 + 1;
    }
  }
  sVar4 = self->anaLen;
  Windowing(self->window,self->dataBuf,sVar4,winData);
  fVar13 = Energy(winData,sVar4);
  if ((fVar13 != 0.0) || (NAN(fVar13))) {
    FFT(self,winData,sVar4,self->magnLen,real,imag,magn);
    iVar2 = self->blockInd;
    sVar4 = self->magnLen;
    if (iVar2 < 0x32) {
      for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
        self->initMagnEst[sVar10] = magn[sVar10] + self->initMagnEst[sVar10];
      }
    }
    for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
      fVar16 = (self->magnPrevProcess[sVar10] / (self->noisePrev[sVar10] + 0.0001)) *
               self->smooth[sVar10] * 0.98 +
               (float)((uint)((magn[sVar10] / (self->noise[sVar10] + 0.0001) + -1.0) * 0.01999998) &
                      -(uint)(self->noise[sVar10] < magn[sVar10]));
      theFilter[sVar10] = fVar16 / (self->overdrive + fVar16);
    }
    for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
      fVar16 = theFilter[sVar10];
      fVar15 = self->denoiseBound;
      fVar17 = fVar15;
      if ((fVar16 < fVar15) || (fVar17 = fVar16, 1.0 < fVar16)) {
        fVar16 = 1.0;
        if (fVar17 <= 1.0) {
          fVar16 = fVar17;
        }
        theFilter[sVar10] = fVar16;
      }
      if (iVar2 < 0x32) {
        fVar17 = (self->initMagnEst[sVar10] - self->overdrive * self->parametricNoise[sVar10]) /
                 (self->initMagnEst[sVar10] + 0.0001);
        if (fVar15 <= fVar17) {
          fVar15 = fVar17;
        }
        fVar17 = 1.0;
        if (fVar15 <= 1.0) {
          fVar17 = fVar15;
        }
        fVar16 = (fVar16 * (float)iVar2 + fVar17 * (float)(0x32 - iVar2)) / 50.0;
        theFilter[sVar10] = fVar16;
      }
      self->smooth[sVar10] = fVar16;
      real[sVar10] = real[sVar10] * fVar16;
      imag[sVar10] = fVar16 * imag[sVar10];
    }
    memcpy(self->magnPrevProcess,magn,sVar4 * 4);
    memcpy(self->noisePrev,self->noise,sVar4 * 4);
    sVar10 = self->anaLen;
    if (sVar4 * 2 - 2 != sVar10) {
      __assert_fail("time_data_length == 2 * (magnitude_length - 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                    ,0x3a4,
                    "void IFFT(NoiseSuppressionC *, const float *, const float *, size_t, size_t, float *)"
                   );
    }
    winData[0] = real[0];
    winData[1] = fout[sVar4 + 0x9f];
    for (uVar9 = 1; uVar9 < sVar4 - 1; uVar9 = uVar9 + 1) {
      winData[uVar9 * 2] = real[uVar9];
      winData[uVar9 * 2 + 1] = imag[uVar9];
    }
    WebRtc_rdft(sVar10,-1,winData,self->ip,self->wfft);
    fVar16 = 1.0;
    for (sVar4 = 0; sVar10 != sVar4; sVar4 = sVar4 + 1) {
      winData[sVar4] = winData[sVar4] * (2.0 / (float)sVar10);
    }
    if ((self->gainmap == 1) && (200 < self->blockInd)) {
      fVar16 = Energy(winData,self->anaLen);
      fVar16 = fVar16 / (fVar13 + 1.0);
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        fVar16 = SQRT(fVar16);
      }
      fVar13 = 1.0;
      if ((0.5 < fVar16) && (fVar13 = (fVar16 + -0.5) * 1.3 + 1.0, 1.0 < fVar16 * fVar13)) {
        fVar13 = 1.0 / fVar16;
      }
      fVar15 = 1.0;
      if (fVar16 < 0.5) {
        uVar12 = -(uint)(fVar16 <= self->denoiseBound);
        fVar15 = (0.5 - (float)(~uVar12 & (uint)fVar16 | (uint)self->denoiseBound & uVar12)) * -0.3
                 + 1.0;
      }
      fVar16 = fVar13 * self->priorSpeechProb + (1.0 - self->priorSpeechProb) * fVar15;
    }
    sVar4 = self->anaLen;
    Windowing(self->window,winData,sVar4,winData);
    pfVar7 = self->syntBuf;
    for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
      pfVar7[sVar10] = winData[sVar10] * fVar16 + pfVar7[sVar10];
    }
    sVar10 = self->blockLen;
    uVar3 = self->windShift;
    uVar9 = sVar10 + uVar3;
    pfVar8 = fout;
    for (; uVar3 < uVar9; uVar3 = uVar3 + 1) {
      *pfVar8 = pfVar7[uVar3];
      pfVar8 = pfVar8 + 1;
    }
    UpdateBuffer((float *)0x0,sVar10,sVar4,pfVar7);
    sVar4 = self->blockLen;
    for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
      fVar13 = fout[sVar10];
      fVar16 = 32767.0;
      if ((fVar13 <= 32767.0) && (fVar16 = -32768.0, -32768.0 <= fVar13)) {
        fVar16 = fVar13;
      }
      (*outFrame)[sVar10] = fVar16;
    }
    if (1 < num_bands) {
      sVar4 = self->magnLen;
      fVar13 = 0.0;
      uVar3 = (long)(int)~local_110c + sVar4;
      for (uVar9 = uVar3; uVar9 < sVar4 - 1; uVar9 = uVar9 + 1) {
        fVar13 = fVar13 + self->speechProb[uVar9];
      }
      fVar15 = 0.0;
      fVar16 = 0.0;
      for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
        fVar15 = fVar15 + self->magnPrevAnalyze[sVar10];
        fVar16 = fVar16 + self->magnPrevProcess[sVar10];
      }
      fVar17 = 0.0;
      for (; uVar3 < sVar4 - 1; uVar3 = uVar3 + 1) {
        fVar17 = fVar17 + self->smooth[uVar3];
      }
      fVar16 = (fVar13 / (float)(int)local_110c) * (fVar16 / fVar15);
      fVar17 = fVar17 / (float)(int)local_110c;
      dVar14 = tanh((double)(fVar16 + fVar16 + -1.0));
      fVar13 = ((float)dVar14 + 1.0) * 0.5;
      fVar16 = (float)(~-(uint)(fVar16 < 0.5) & (uint)(fVar13 * 0.25 + fVar17 * 0.75) |
                      (uint)(fVar13 * 0.5 + fVar17 * 0.5) & -(uint)(fVar16 < 0.5));
      fVar13 = self->denoiseBound;
      if (self->denoiseBound <= fVar16) {
        fVar13 = fVar16;
      }
      fVar16 = 1.0;
      if (fVar13 <= 1.0) {
        fVar16 = fVar13;
      }
      pafVar5 = self->dataBufHB;
      for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
        sVar4 = self->blockLen;
        for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
          fVar15 = (*pafVar5)[sVar10] * fVar16;
          fVar13 = 32767.0;
          if ((fVar15 <= 32767.0) && (fVar13 = -32768.0, -32768.0 <= fVar15)) {
            fVar13 = fVar15;
          }
          ppfVar11[uVar9][sVar10] = fVar13;
        }
        pafVar5 = pafVar5 + 1;
      }
    }
  }
  else {
    sVar10 = self->blockLen;
    uVar3 = self->windShift;
    uVar9 = sVar10 + uVar3;
    pfVar7 = fout;
    for (; uVar3 < uVar9; uVar3 = uVar3 + 1) {
      *pfVar7 = self->syntBuf[uVar3];
      pfVar7 = pfVar7 + 1;
    }
    UpdateBuffer((float *)0x0,sVar10,sVar4,self->syntBuf);
    sVar4 = self->blockLen;
    for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
      fVar13 = fout[sVar10];
      fVar16 = 32767.0;
      if ((fVar13 <= 32767.0) && (fVar16 = -32768.0, -32768.0 <= fVar13)) {
        fVar16 = fVar13;
      }
      (*outFrame)[sVar10] = fVar16;
    }
    if (1 < num_bands) {
      pafVar5 = self->dataBufHB;
      for (uVar9 = 0; uVar9 != uVar1; uVar9 = uVar9 + 1) {
        for (sVar10 = 0; sVar4 != sVar10; sVar10 = sVar10 + 1) {
          fVar13 = (*pafVar5)[sVar10];
          fVar16 = 32767.0;
          if ((fVar13 <= 32767.0) && (fVar16 = -32768.0, -32768.0 <= fVar13)) {
            fVar16 = fVar13;
          }
          ppfVar11[uVar9][sVar10] = fVar16;
        }
        pafVar5 = pafVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

void WebRtcNs_ProcessCore(NoiseSuppressionC* self,
                          const float* const* speechFrame,
                          size_t num_bands,
                          float* const* outFrame) {
  // Main routine for noise reduction.
  int flagHB = 0;
  size_t i, j;

  float energy1, energy2, gain, factor, factor1, factor2;
  float fout[BLOCKL_MAX];
  float winData[ANAL_BLOCKL_MAX];
  float magn[HALF_ANAL_BLOCKL];
  float theFilter[HALF_ANAL_BLOCKL], theFilterTmp[HALF_ANAL_BLOCKL];
  float real[ANAL_BLOCKL_MAX], imag[HALF_ANAL_BLOCKL];

  // SWB variables.
  int deltaBweHB = 1;
  int deltaGainHB = 1;
  float decayBweHB = 1.0;
  float gainMapParHB = 1.0;
  float gainTimeDomainHB = 1.0;
  float avgProbSpeechHB, avgProbSpeechHBTmp, avgFilterGainHB, gainModHB;
  float sumMagnAnalyze, sumMagnProcess;

  // Check that initiation has been done.
  assert(self->initFlag == 1);
  assert((num_bands - 1) <= NUM_HIGH_BANDS_MAX);

  const float* const* speechFrameHB = NULL;
  float* const* outFrameHB = NULL;
  size_t num_high_bands = 0;
  if (num_bands > 1) {
    speechFrameHB = &speechFrame[1];
    outFrameHB = &outFrame[1];
    num_high_bands = num_bands - 1;
    flagHB = 1;
    // Range for averaging low band quantities for H band gain.
    deltaBweHB = (int)self->magnLen / 4;
    deltaGainHB = deltaBweHB;
  }

  // Update analysis buffer for L band.
  UpdateBuffer(speechFrame[0], self->blockLen, self->anaLen, self->dataBuf);

  if (flagHB == 1) {
    // Update analysis buffer for H bands.
    for (i = 0; i < num_high_bands; ++i) {
      UpdateBuffer(speechFrameHB[i],
                   self->blockLen,
                   self->anaLen,
                   self->dataBufHB[i]);
    }
  }

  Windowing(self->window, self->dataBuf, self->anaLen, winData);
  energy1 = Energy(winData, self->anaLen);
  if (energy1 == 0.0) {
    // Synthesize the special case of zero input.
    // Read out fully processed segment.
    for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
      fout[i - self->windShift] = self->syntBuf[i];
    }
    // Update synthesis buffer.
    UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

    for (i = 0; i < self->blockLen; ++i)
      outFrame[0][i] =
          WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

    // For time-domain gain of HB.
    if (flagHB == 1) {
      for (i = 0; i < num_high_bands; ++i) {
        for (j = 0; j < self->blockLen; ++j) {
          outFrameHB[i][j] = WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                                            self->dataBufHB[i][j],
                                            WEBRTC_SPL_WORD16_MIN);
        }
      }
    }

    return;
  }

  FFT(self, winData, self->anaLen, self->magnLen, real, imag, magn);

  if (self->blockInd < END_STARTUP_SHORT) {
    for (i = 0; i < self->magnLen; i++) {
      self->initMagnEst[i] += magn[i];
    }
  }

  ComputeDdBasedWienerFilter(self, magn, theFilter);

  for (i = 0; i < self->magnLen; i++) {
    // Flooring bottom.
    if (theFilter[i] < self->denoiseBound) {
      theFilter[i] = self->denoiseBound;
    }
    // Flooring top.
    if (theFilter[i] > 1.f) {
      theFilter[i] = 1.f;
    }
    if (self->blockInd < END_STARTUP_SHORT) {
      theFilterTmp[i] =
          (self->initMagnEst[i] - self->overdrive * self->parametricNoise[i]);
      theFilterTmp[i] /= (self->initMagnEst[i] + 0.0001f);
      // Flooring bottom.
      if (theFilterTmp[i] < self->denoiseBound) {
        theFilterTmp[i] = self->denoiseBound;
      }
      // Flooring top.
      if (theFilterTmp[i] > 1.f) {
        theFilterTmp[i] = 1.f;
      }
      // Weight the two suppression filters.
      theFilter[i] *= (self->blockInd);
      theFilterTmp[i] *= (END_STARTUP_SHORT - self->blockInd);
      theFilter[i] += theFilterTmp[i];
      theFilter[i] /= (END_STARTUP_SHORT);
    }

    self->smooth[i] = theFilter[i];
    real[i] *= self->smooth[i];
    imag[i] *= self->smooth[i];
  }
  // Keep track of |magn| spectrum for next frame.
  memcpy(self->magnPrevProcess, magn, sizeof(*magn) * self->magnLen);
  memcpy(self->noisePrev, self->noise, sizeof(self->noise[0]) * self->magnLen);
  // Back to time domain.
  IFFT(self, real, imag, self->magnLen, self->anaLen, winData);

  // Scale factor: only do it after END_STARTUP_LONG time.
  factor = 1.f;
  if (self->gainmap == 1 && self->blockInd > END_STARTUP_LONG) {
    factor1 = 1.f;
    factor2 = 1.f;

    energy2 = Energy(winData, self->anaLen);
    gain = (float)sqrt(energy2 / (energy1 + 1.f));

    // Scaling for new version.
    if (gain > B_LIM) {
      factor1 = 1.f + 1.3f * (gain - B_LIM);
      if (gain * factor1 > 1.f) {
        factor1 = 1.f / gain;
      }
    }
    if (gain < B_LIM) {
      // Don't reduce scale too much for pause regions:
      // attenuation here should be controlled by flooring.
      if (gain <= self->denoiseBound) {
        gain = self->denoiseBound;
      }
      factor2 = 1.f - 0.3f * (B_LIM - gain);
    }
    // Combine both scales with speech/noise prob:
    // note prior (priorSpeechProb) is not frequency dependent.
    factor = self->priorSpeechProb * factor1 +
             (1.f - self->priorSpeechProb) * factor2;
  }  // Out of self->gainmap == 1.

  Windowing(self->window, winData, self->anaLen, winData);

  // Synthesis.
  for (i = 0; i < self->anaLen; i++) {
    self->syntBuf[i] += factor * winData[i];
  }
  // Read out fully processed segment.
  for (i = self->windShift; i < self->blockLen + self->windShift; i++) {
    fout[i - self->windShift] = self->syntBuf[i];
  }
  // Update synthesis buffer.
  UpdateBuffer(NULL, self->blockLen, self->anaLen, self->syntBuf);

  for (i = 0; i < self->blockLen; ++i)
    outFrame[0][i] =
        WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX, fout[i], WEBRTC_SPL_WORD16_MIN);

  // For time-domain gain of HB.
  if (flagHB == 1) {
    // Average speech prob from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgProbSpeechHB = 0.0;
    for (i = self->magnLen - deltaBweHB - 1; i < self->magnLen - 1; i++) {
      avgProbSpeechHB += self->speechProb[i];
    }
    avgProbSpeechHB = avgProbSpeechHB / ((float)deltaBweHB);
    // If the speech was suppressed by a component between Analyze and
    // Process, for example the AEC, then it should not be considered speech
    // for high band suppression purposes.
    sumMagnAnalyze = 0;
    sumMagnProcess = 0;
    for (i = 0; i < self->magnLen; ++i) {
      sumMagnAnalyze += self->magnPrevAnalyze[i];
      sumMagnProcess += self->magnPrevProcess[i];
    }
    avgProbSpeechHB *= sumMagnProcess / sumMagnAnalyze;
    // Average filter gain from low band.
    // Average over second half (i.e., 4->8kHz) of frequencies spectrum.
    avgFilterGainHB = 0.0;
    for (i = self->magnLen - deltaGainHB - 1; i < self->magnLen - 1; i++) {
      avgFilterGainHB += self->smooth[i];
    }
    avgFilterGainHB = avgFilterGainHB / ((float)(deltaGainHB));
    avgProbSpeechHBTmp = 2.f * avgProbSpeechHB - 1.f;
    // Gain based on speech probability.
    gainModHB = 0.5f * (1.f + (float)tanh(gainMapParHB * avgProbSpeechHBTmp));
    // Combine gain with low band gain.
    gainTimeDomainHB = 0.5f * gainModHB + 0.5f * avgFilterGainHB;
    if (avgProbSpeechHB >= 0.5f) {
      gainTimeDomainHB = 0.25f * gainModHB + 0.75f * avgFilterGainHB;
    }
    gainTimeDomainHB = gainTimeDomainHB * decayBweHB;
    // Make sure gain is within flooring range.
    // Flooring bottom.
    if (gainTimeDomainHB < self->denoiseBound) {
      gainTimeDomainHB = self->denoiseBound;
    }
    // Flooring top.
    if (gainTimeDomainHB > 1.f) {
      gainTimeDomainHB = 1.f;
    }
    // Apply gain.
    for (i = 0; i < num_high_bands; ++i) {
      for (j = 0; j < self->blockLen; j++) {
        outFrameHB[i][j] =
            WEBRTC_SPL_SAT(WEBRTC_SPL_WORD16_MAX,
                           gainTimeDomainHB * self->dataBufHB[i][j],
                           WEBRTC_SPL_WORD16_MIN);
      }
    }
  }  // End of H band gain computation.
}